

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binder.h
# Opt level: O2

pointer_type
cppcms::impl::
mfunc_to_io_handler<cppcms::impl::cgi::connection,std::shared_ptr<cppcms::impl::cgi::connection>,cppcms::http::context*,booster::callback<void(cppcms::http::context::completion_type)>const&,cppcms::http::context*,booster::callback<void(cppcms::http::context::completion_type)>>
          (offset_in_connection_to_subr f,shared_ptr<cppcms::impl::cgi::connection> *s,context **p1,
          callback<void_(cppcms::http::context::completion_type)> *p2)

{
  io_handler_binder_p2<void_(cppcms::impl::cgi::connection::*)(const_std::error_code_&,_unsigned_long,_cppcms::http::context_*,_const_booster::callback<void_(cppcms::http::context::completion_type)>_&),_std::shared_ptr<cppcms::impl::cgi::connection>,_cppcms::http::context_*,_booster::callback<void_(cppcms::http::context::completion_type)>_>
  *this;
  context **in_R8;
  callback<void_(cppcms::http::context::completion_type)> *in_R9;
  shared_ptr<cppcms::impl::cgi::connection> *local_40;
  context **local_38;
  
  local_40 = s;
  local_38 = p1;
  this = (io_handler_binder_p2<void_(cppcms::impl::cgi::connection::*)(const_std::error_code_&,_unsigned_long,_cppcms::http::context_*,_const_booster::callback<void_(cppcms::http::context::completion_type)>_&),_std::shared_ptr<cppcms::impl::cgi::connection>,_cppcms::http::context_*,_booster::callback<void_(cppcms::http::context::completion_type)>_>
          *)operator_new(0x40);
  io_handler_binder_p2<void_(cppcms::impl::cgi::connection::*)(const_std::error_code_&,_unsigned_long,_cppcms::http::context_*,_const_booster::callback<void_(cppcms::http::context::completion_type)>_&),_std::shared_ptr<cppcms::impl::cgi::connection>,_cppcms::http::context_*,_booster::callback<void_(cppcms::http::context::completion_type)>_>
  ::io_handler_binder_p2
            (this,(offset_in_connection_to_subr *)&local_40,
             (shared_ptr<cppcms::impl::cgi::connection> *)p2,in_R8,in_R9);
  *(io_handler_binder_p2<void_(cppcms::impl::cgi::connection::*)(const_std::error_code_&,_unsigned_long,_cppcms::http::context_*,_const_booster::callback<void_(cppcms::http::context::completion_type)>_&),_std::shared_ptr<cppcms::impl::cgi::connection>,_cppcms::http::context_*,_booster::callback<void_(cppcms::http::context::completion_type)>_>
    **)f = this;
  booster::atomic_counter::inc();
  return (pointer_type)(callable<void_(const_std::error_code_&,_unsigned_long)> *)f;
}

Assistant:

booster::aio::io_handler::pointer_type mfunc_to_io_handler(void (C::*f)(booster::system::error_code const &,size_t,P1,P2),S s,P1in const &p1,P2in const &p2)
{
	return new io_handler_binder_p2<void (C::*)(booster::system::error_code const &,size_t,P1,P2),S,P1in,P2in>(f,s,p1,p2);
}